

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

version_type __thiscall
unodb::optimistic_lock::atomic_version_type::load_relaxed(atomic_version_type *this)

{
  atomic_version_type *this_local;
  version_tag_type local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  local_14 = 0;
  ___b = this;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14 - 1U < 2) {
    local_20 = (this->version).super___atomic_base<unsigned_long>._M_i;
  }
  else if (local_14 == 5) {
    local_20 = (this->version).super___atomic_base<unsigned_long>._M_i;
  }
  else {
    local_20 = (this->version).super___atomic_base<unsigned_long>._M_i;
  }
  version_type::version_type((version_type *)&this_local,local_20);
  return (version_type)(version_tag_type)this_local;
}

Assistant:

[[nodiscard]] version_type load_relaxed() const noexcept {
      return version_type{version.load(std::memory_order_relaxed)};
    }